

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

reference __thiscall
absl::
InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
::GrowAndEmplaceBack<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>
          (InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
           *this,QueueEntry *args)

{
  Allocation new_allocation_00;
  size_type sVar1;
  size_type sVar2;
  allocator_type *a;
  pointer pQVar3;
  reference pQVar4;
  move_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry_*> src;
  move_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry_*> src_last;
  reference new_element;
  Allocation new_allocation;
  size_type s;
  QueueEntry *args_local;
  InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,_16UL,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>_>
  *this_local;
  
  sVar1 = size(this);
  sVar2 = capacity(this);
  if (sVar1 == sVar2) {
    new_allocation.buffer_ = (pointer)size(this);
    a = allocator(this);
    sVar1 = capacity(this);
    Allocation::Allocation((Allocation *)&new_element,a,sVar1 << 1);
    pQVar3 = Allocation::buffer((Allocation *)&new_element);
    pQVar4 = Construct<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>
                       (this,pQVar3 + (long)new_allocation.buffer_,args);
    pQVar3 = data(this);
    src = std::make_move_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry*>(pQVar3);
    pQVar3 = data(this);
    src_last = std::make_move_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry*>
                         (pQVar3 + (long)new_allocation.buffer_);
    pQVar3 = Allocation::buffer((Allocation *)&new_element);
    InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>>
    ::UninitializedCopy<std::move_iterator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry*>>
              ((InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry,16ul,std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>>
                *)this,src,src_last,pQVar3);
    new_allocation_00.buffer_ = (pointer)new_allocation.capacity_;
    new_allocation_00.capacity_ = (size_type)new_element;
    ResetAllocation(this,new_allocation_00,
                    (size_type)((long)&((new_allocation.buffer_)->distance).distance_.length2_ + 1))
    ;
    return pQVar4;
  }
  __assert_fail("size() == capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x327,
                "reference absl::InlinedVector<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, 16>::GrowAndEmplaceBack(Args &&...) [T = S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry, N = 16, A = std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>, Args = <S2ClosestEdgeQueryBase<S2MaxDistance>::QueueEntry>]"
               );
}

Assistant:

reference GrowAndEmplaceBack(Args&&... args) {
    assert(size() == capacity());
    const size_type s = size();

    Allocation new_allocation(allocator(), 2 * capacity());

    reference new_element =
        Construct(new_allocation.buffer() + s, std::forward<Args>(args)...);
    UninitializedCopy(std::make_move_iterator(data()),
                      std::make_move_iterator(data() + s),
                      new_allocation.buffer());

    ResetAllocation(new_allocation, s + 1);

    return new_element;
  }